

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O1

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_item(Am_Priority_List *this,Am_Priority_List_Item *item)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item **ppAVar2;
  
  if (this->current == item) {
    this->current = item->prev;
  }
  pAVar1 = item->prev;
  ppAVar2 = &pAVar1->next;
  if (pAVar1 == (Am_Priority_List_Item *)0x0) {
    ppAVar2 = &this->head;
  }
  *ppAVar2 = item->next;
  ppAVar2 = &item->next->prev;
  if (item->next == (Am_Priority_List_Item *)0x0) {
    ppAVar2 = &this->tail;
  }
  *ppAVar2 = pAVar1;
  return item;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_item(Am_Priority_List_Item *item)
{
  if (current == item) {
    current = item->prev; // go to prev so when do next on the next
                          // iteration, will do the next item in the list
  }

  if (item->prev)
    item->prev->next = item->next;
  else
    head = item->next;

  if (item->next)
    item->next->prev = item->prev;
  else
    tail = item->prev;
  return item;
}